

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O3

int IDARcheck3(IDAMem IDA_mem)

{
  uint uVar1;
  int *piVar2;
  sunrealtype *psVar3;
  int *piVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  ulong uVar17;
  sunrealtype *psVar18;
  int iVar19;
  sunrealtype t;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  if (IDA_mem->ida_taskc == 1) {
    uVar10 = -(ulong)((IDA_mem->ida_toutc - IDA_mem->ida_tn) * IDA_mem->ida_hh < 0.0);
    t = (sunrealtype)(~uVar10 & (ulong)IDA_mem->ida_tn | (ulong)IDA_mem->ida_toutc & uVar10);
    IDA_mem->ida_thi = t;
  }
  else if (IDA_mem->ida_taskc == 2) {
    t = IDA_mem->ida_tn;
    IDA_mem->ida_thi = t;
  }
  else {
    t = IDA_mem->ida_thi;
  }
  IDAGetSolution(IDA_mem,t,IDA_mem->ida_yy,IDA_mem->ida_yp);
  iVar8 = (*IDA_mem->ida_gfun)
                    (IDA_mem->ida_thi,IDA_mem->ida_yy,IDA_mem->ida_yp,IDA_mem->ida_ghi,
                     IDA_mem->ida_user_data);
  IDA_mem->ida_nge = IDA_mem->ida_nge + 1;
  if (iVar8 != 0) {
    return -10;
  }
  dVar20 = (ABS(IDA_mem->ida_hh) + ABS(IDA_mem->ida_tn)) * IDA_mem->ida_uround * 100.0;
  IDA_mem->ida_ttol = dVar20;
  uVar10 = (ulong)(uint)IDA_mem->ida_nrtfn;
  if (IDA_mem->ida_nrtfn < 1) {
    IDA_mem->ida_trout = IDA_mem->ida_thi;
    IDA_mem->ida_tlo = IDA_mem->ida_thi;
LAB_0010dc91:
    iVar8 = 0;
  }
  else {
    piVar2 = IDA_mem->ida_gactive;
    bVar16 = true;
    bVar7 = false;
    iVar8 = 0;
    uVar17 = 0;
    dVar23 = 0.0;
LAB_0010d53a:
    do {
      uVar13 = uVar17 + 1;
      if (piVar2[uVar17] != 0) {
        dVar21 = IDA_mem->ida_ghi[uVar17];
        if ((dVar21 != 0.0) || (NAN(dVar21))) {
          dVar5 = IDA_mem->ida_glo[uVar17];
          if ((((0.0 < dVar21) && (dVar5 < 0.0)) || ((dVar21 < 0.0 && (0.0 < dVar5)))) &&
             (((double)IDA_mem->ida_rootdir[uVar17] * dVar5 <= 0.0 &&
              (dVar21 = ABS(dVar21 / (dVar21 - dVar5)), dVar23 < dVar21)))) {
            iVar8 = (int)uVar17;
            bVar16 = false;
            uVar17 = uVar13;
            dVar23 = dVar21;
            if (uVar10 == uVar13) {
              iVar8 = (int)uVar13 + -1;
              goto LAB_0010d6eb;
            }
            goto LAB_0010d53a;
          }
        }
        else if ((double)IDA_mem->ida_rootdir[uVar17] * IDA_mem->ida_glo[uVar17] <= 0.0) {
          bVar7 = true;
        }
      }
      uVar17 = uVar13;
    } while (uVar13 != uVar10);
    if (bVar16) {
      IDA_mem->ida_trout = IDA_mem->ida_thi;
      psVar18 = IDA_mem->ida_ghi;
      psVar3 = IDA_mem->ida_grout;
      uVar17 = 0;
      do {
        psVar3[uVar17] = psVar18[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar10 != uVar17);
      if (bVar7) {
        piVar4 = IDA_mem->ida_iroots;
        lVar15 = 0;
        do {
          piVar4[lVar15] = 0;
          if (((piVar2[lVar15] != 0) && (psVar18[lVar15] == 0.0)) &&
             ((double)IDA_mem->ida_rootdir[lVar15] * IDA_mem->ida_glo[lVar15] <= 0.0)) {
            piVar4[lVar15] = (uint)(IDA_mem->ida_glo[lVar15] <= 0.0) * 2 + -1;
          }
          lVar15 = lVar15 + 1;
          uVar10 = (ulong)IDA_mem->ida_nrtfn;
        } while (lVar15 < (long)uVar10);
        goto LAB_0010dbfe;
      }
      bVar7 = true;
LAB_0010dc00:
      if ((int)uVar10 < 1) {
        IDA_mem->ida_tlo = IDA_mem->ida_trout;
      }
      else {
        piVar2 = IDA_mem->ida_gactive;
        lVar15 = 0;
        do {
          if ((piVar2[lVar15] == 0) &&
             ((IDA_mem->ida_grout[lVar15] != 0.0 || (NAN(IDA_mem->ida_grout[lVar15]))))) {
            piVar2[lVar15] = 1;
            uVar10 = (ulong)(uint)IDA_mem->ida_nrtfn;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < (int)uVar10);
        IDA_mem->ida_tlo = IDA_mem->ida_trout;
        if (0 < (int)uVar10) {
          psVar18 = IDA_mem->ida_glo;
          psVar3 = IDA_mem->ida_grout;
          uVar17 = 0;
          do {
            psVar18[uVar17] = psVar3[uVar17];
            uVar17 = uVar17 + 1;
          } while ((uVar10 & 0xffffffff) != uVar17);
        }
      }
      if (bVar7) goto LAB_0010dc91;
    }
    else {
LAB_0010d6eb:
      dVar23 = IDA_mem->ida_tlo;
      dVar21 = IDA_mem->ida_thi;
      dVar5 = dVar21 - dVar23;
      dVar6 = ABS(dVar5);
      if (dVar6 <= dVar20) {
LAB_0010db10:
        IDA_mem->ida_trout = dVar21;
LAB_0010db18:
        piVar2 = IDA_mem->ida_iroots;
        psVar18 = IDA_mem->ida_ghi;
        psVar3 = IDA_mem->ida_grout;
        piVar4 = IDA_mem->ida_gactive;
        lVar15 = 0;
        do {
          dVar20 = psVar18[lVar15];
          psVar3[lVar15] = dVar20;
          piVar2[lVar15] = 0;
          if (piVar4[lVar15] != 0) {
            if ((dVar20 != 0.0) || (NAN(dVar20))) {
              dVar23 = IDA_mem->ida_glo[lVar15];
            }
            else {
              dVar23 = IDA_mem->ida_glo[lVar15];
              if ((double)IDA_mem->ida_rootdir[lVar15] * dVar23 <= 0.0) {
                piVar2[lVar15] = (uint)(dVar23 <= 0.0) * 2 + -1;
              }
            }
            if ((((0.0 < dVar20) && (dVar23 < 0.0)) || ((dVar20 < 0.0 && (0.0 < dVar23)))) &&
               ((double)IDA_mem->ida_rootdir[lVar15] * dVar23 <= 0.0)) {
              piVar2[lVar15] = (uint)(dVar23 <= 0.0) * 2 + -1;
            }
          }
          lVar15 = lVar15 + 1;
          uVar10 = (ulong)IDA_mem->ida_nrtfn;
        } while (lVar15 < (long)uVar10);
LAB_0010dbfe:
        bVar7 = false;
        goto LAB_0010dc00;
      }
      dVar24 = 1.0;
      dVar22 = 0.5;
      iVar9 = -1;
      iVar19 = 0;
      do {
        if (iVar9 == iVar19) {
          dVar24 = dVar24 * dVar22;
        }
        else {
          dVar24 = 1.0;
        }
        dVar22 = dVar21 - (dVar5 * IDA_mem->ida_ghi[iVar8]) /
                          (IDA_mem->ida_ghi[iVar8] - IDA_mem->ida_glo[iVar8] * dVar24);
        dVar6 = dVar6 / dVar20;
        if (ABS(dVar22 - dVar23) < dVar20 * 0.5) {
          dVar22 = (double)(-(ulong)(5.0 < dVar6) & 0x3fb999999999999a |
                           ~-(ulong)(5.0 < dVar6) & (ulong)(0.5 / dVar6)) * dVar5 + dVar23;
        }
        dVar23 = dVar22;
        if (ABS(dVar21 - dVar22) < dVar20 * 0.5) {
          dVar23 = (double)(-(ulong)(5.0 < dVar6) & 0xbfb999999999999a |
                           ~-(ulong)(5.0 < dVar6) & (ulong)(-0.5 / dVar6)) * dVar5 + dVar21;
        }
        IDAGetSolution(IDA_mem,dVar23,IDA_mem->ida_yy,IDA_mem->ida_yp);
        iVar9 = (*IDA_mem->ida_gfun)
                          (dVar23,IDA_mem->ida_yy,IDA_mem->ida_yp,IDA_mem->ida_grout,
                           IDA_mem->ida_user_data);
        IDA_mem->ida_nge = IDA_mem->ida_nge + 1;
        if (iVar9 != 0) {
          return -10;
        }
        uVar1 = IDA_mem->ida_nrtfn;
        lVar15 = (long)(int)uVar1;
        if (0 < lVar15) {
          bVar16 = true;
          bVar7 = false;
          lVar14 = 0;
          dVar20 = 0.0;
LAB_0010d8c3:
          do {
            lVar11 = lVar14 + 1;
            if (IDA_mem->ida_gactive[lVar14] != 0) {
              psVar18 = IDA_mem->ida_grout;
              dVar21 = psVar18[lVar14];
              if ((dVar21 != 0.0) || (NAN(dVar21))) {
                dVar5 = IDA_mem->ida_glo[lVar14];
                if ((((0.0 < dVar21) && (dVar5 < 0.0)) || ((dVar21 < 0.0 && (0.0 < dVar5)))) &&
                   (((double)IDA_mem->ida_rootdir[lVar14] * dVar5 <= 0.0 &&
                    (dVar21 = ABS(dVar21 / (dVar21 - dVar5)), dVar20 < dVar21)))) {
                  iVar8 = (int)lVar14;
                  bVar16 = false;
                  lVar14 = lVar11;
                  dVar20 = dVar21;
                  if (lVar11 == lVar15) {
                    iVar8 = (int)lVar11 + -1;
                    goto LAB_0010da44;
                  }
                  goto LAB_0010d8c3;
                }
              }
              else if ((double)IDA_mem->ida_rootdir[lVar14] * IDA_mem->ida_glo[lVar14] <= 0.0) {
                bVar7 = true;
              }
            }
            lVar14 = lVar11;
          } while (lVar11 != lVar15);
          if (bVar16) {
            if (!bVar7) {
              IDA_mem->ida_tlo = dVar23;
              psVar18 = IDA_mem->ida_glo;
              psVar3 = IDA_mem->ida_grout;
              lVar14 = 0;
              do {
                psVar18[lVar14] = psVar3[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar15 != lVar14);
              dVar23 = IDA_mem->ida_tlo;
              goto LAB_0010da03;
            }
            IDA_mem->ida_thi = dVar23;
            psVar18 = IDA_mem->ida_ghi;
            psVar3 = IDA_mem->ida_grout;
            uVar10 = 0;
            do {
              psVar18[uVar10] = psVar3[uVar10];
              uVar10 = uVar10 + 1;
            } while (uVar1 != uVar10);
            dVar21 = IDA_mem->ida_thi;
            goto LAB_0010db10;
          }
          psVar18 = IDA_mem->ida_grout;
LAB_0010da44:
          IDA_mem->ida_thi = dVar23;
          psVar3 = IDA_mem->ida_ghi;
          lVar14 = 0;
          do {
            psVar3[lVar14] = psVar18[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar15 != lVar14);
          dVar23 = IDA_mem->ida_tlo;
          dVar21 = IDA_mem->ida_thi;
          dVar5 = dVar21 - dVar23;
          dVar6 = ABS(dVar5);
          dVar20 = IDA_mem->ida_ttol;
          if (dVar20 < dVar6) {
            iVar12 = 1;
            dVar22 = 0.5;
            goto LAB_0010daa4;
          }
          break;
        }
        IDA_mem->ida_tlo = dVar23;
LAB_0010da03:
        dVar21 = IDA_mem->ida_thi;
        dVar20 = IDA_mem->ida_ttol;
        dVar5 = dVar21 - dVar23;
        dVar6 = ABS(dVar5);
        if (dVar6 <= dVar20) break;
        iVar12 = 2;
        dVar22 = 2.0;
LAB_0010daa4:
        iVar9 = iVar19;
        iVar19 = iVar12;
      } while (dVar20 < dVar6);
      IDA_mem->ida_trout = dVar21;
      if (0 < (int)uVar1) goto LAB_0010db18;
      IDA_mem->ida_tlo = IDA_mem->ida_trout;
    }
    IDAGetSolution(IDA_mem,IDA_mem->ida_trout,IDA_mem->ida_yy,IDA_mem->ida_yp);
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

static int IDARcheck3(IDAMem IDA_mem)
{
  int i, ier, retval;

  /* Set thi = tn or tout, whichever comes first. */
  if (IDA_mem->ida_taskc == IDA_ONE_STEP)
  {
    IDA_mem->ida_thi = IDA_mem->ida_tn;
  }
  if (IDA_mem->ida_taskc == IDA_NORMAL)
  {
    IDA_mem->ida_thi =
      ((IDA_mem->ida_toutc - IDA_mem->ida_tn) * IDA_mem->ida_hh >= ZERO)
        ? IDA_mem->ida_tn
        : IDA_mem->ida_toutc;
  }

  /* Get y and y' at thi. */
  (void)IDAGetSolution(IDA_mem, IDA_mem->ida_thi, IDA_mem->ida_yy,
                       IDA_mem->ida_yp);

  /* Set ghi = g(thi) and call IDARootfind to search (tlo,thi) for roots. */
  retval = IDA_mem->ida_gfun(IDA_mem->ida_thi, IDA_mem->ida_yy, IDA_mem->ida_yp,
                             IDA_mem->ida_ghi, IDA_mem->ida_user_data);
  IDA_mem->ida_nge++;
  if (retval != 0) { return (IDA_RTFUNC_FAIL); }

  IDA_mem->ida_ttol = ((SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh)) *
                       IDA_mem->ida_uround * HUNDRED);
  ier               = IDARootfind(IDA_mem);
  if (ier == IDA_RTFUNC_FAIL) { return (IDA_RTFUNC_FAIL); }
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    if (!IDA_mem->ida_gactive[i] && IDA_mem->ida_grout[i] != ZERO)
    {
      IDA_mem->ida_gactive[i] = SUNTRUE;
    }
  }
  IDA_mem->ida_tlo = IDA_mem->ida_trout;
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    IDA_mem->ida_glo[i] = IDA_mem->ida_grout[i];
  }

  /* If no root found, return IDA_SUCCESS. */
  if (ier == IDA_SUCCESS) { return (IDA_SUCCESS); }

  /* If a root was found, interpolate to get y(trout) and return.  */
  (void)IDAGetSolution(IDA_mem, IDA_mem->ida_trout, IDA_mem->ida_yy,
                       IDA_mem->ida_yp);
  return (RTFOUND);
}